

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O2

void __thiscall
TEST_MockReturnValueTest_WhenADoubleReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
::testBody(TEST_MockReturnValueTest_WhenADoubleReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
           *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  undefined4 extraout_var_00;
  TestTerminator *pTVar4;
  undefined8 extraout_XMM0_Qa;
  SimpleString SStack_38;
  undefined8 local_28;
  SimpleString local_20;
  
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_20);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xf8))
            (0x4028000000000000,(long *)CONCAT44(extraout_var,iVar1));
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&SStack_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_20);
  local_28 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x138))
                       (0x4025666666666666,(long *)CONCAT44(extraout_var_00,iVar1));
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x15])
            (0x4028000000000000,local_28,0x3fa999999999999a,pUVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xe0,pTVar4);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&SStack_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x19])(0x4025666666666666,pMVar2);
  local_28 = extraout_XMM0_Qa;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x15])
            (0x4028000000000000,local_28,0x3fa999999999999a,pUVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xe1,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenADoubleReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault)
{
    double default_return_value = 10.7;
    double expected_return_value = default_return_value + 1.3;
    mock().expectOneCall("foo").andReturnValue(expected_return_value);

    DOUBLES_EQUAL(expected_return_value, mock().actualCall("foo").returnDoubleValueOrDefault(default_return_value), 0.05);
    DOUBLES_EQUAL(expected_return_value, mock().returnDoubleValueOrDefault(default_return_value), 0.05);
}